

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  int local_50 [2];
  int menu;
  undefined1 local_40 [8];
  Shop shop;
  
  shop.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  system("COLOR 0");
  Shop::Shop((Shop *)local_40);
  Shop::initMedicineList((Shop *)local_40);
  do {
    system("cls");
    std::operator<<((ostream *)&std::cout,"Please chose an option: \n \n");
    std::operator<<((ostream *)&std::cout,"\t1. Add New Sale \t\n");
    std::operator<<((ostream *)&std::cout,"\t2. View All Medicine \t\n");
    std::operator<<((ostream *)&std::cout,"\t3. Sold Medicines List \t\n");
    std::operator<<((ostream *)&std::cout,"\t4. Add New Medicines\t\n");
    std::operator<<((ostream *)&std::cout,"\t5. Update Medicine Details \t\n");
    std::operator<<((ostream *)&std::cout,"\t6. Delete Medicine From Stock \t\n");
    std::operator<<((ostream *)&std::cout,"\t7. Total Sales Report\t\n\n");
    std::operator<<((ostream *)&std::cout,"Enter your choice: ");
    std::istream::operator>>((istream *)&std::cin,local_50);
    switch(local_50[0]) {
    case 1:
      Shop::addNewSale((Shop *)local_40);
      system("PAUSE");
      break;
    case 2:
      Shop::printMedicines((Shop *)local_40);
      system("PAUSE");
      break;
    case 3:
      Shop::soldMedicinesList((Shop *)local_40);
      system("PAUSE");
      break;
    case 4:
      Shop::addNewMedicine((Shop *)local_40);
      system("PAUSE");
      break;
    case 5:
      Shop::updateMedicineDetails((Shop *)local_40);
      system("PAUSE");
      break;
    case 6:
      Shop::deleteMedicineFromStock((Shop *)local_40);
      system("PAUSE");
      break;
    case 7:
      Shop::totalSalesReport((Shop *)local_40);
      system("PAUSE");
      break;
    default:
      this = std::operator<<((ostream *)&std::cout,"You enter invalid input\nre-enter the input\n");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  } while (local_50[0] != 7);
  shop.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  Shop::~Shop((Shop *)local_40);
  return shop.salesList.super__Vector_base<Sale,_std::allocator<Sale>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    system("COLOR 0");
    Shop shop;
    shop.initMedicineList();
    int menu;
    do {
        system("cls");
        cout << "Please chose an option: \n \n";

        cout << "\t1. Add New Sale \t\n";
        cout << "\t2. View All Medicine \t\n";
        cout << "\t3. Sold Medicines List \t\n";
        cout << "\t4. Add New Medicines\t\n";
        cout << "\t5. Update Medicine Details \t\n";
        cout << "\t6. Delete Medicine From Stock \t\n";
        cout << "\t7. Total Sales Report\t\n\n";
        cout << "Enter your choice: ";

        cin >> menu;

        switch (menu) {
            case 1: {
                shop.addNewSale();
                system("PAUSE");
                break;
            }

            case 2: {
                shop.printMedicines();
                system("PAUSE");
                break;
            }

            case 3: {
                shop.soldMedicinesList();
                system("PAUSE");
                break;
            }

            case 4: {
                shop.addNewMedicine();
                system("PAUSE");
                break;
            }
            case 5: {
                shop.updateMedicineDetails();
                system("PAUSE");
                break;
            }
            case 6: {
                shop.deleteMedicineFromStock();
                system("PAUSE");
                break;
            }
            case 7: {
                shop.totalSalesReport();
                system("PAUSE");
                break;
            }
            default: {
                cout << "You enter invalid input\nre-enter the input\n" << endl;
                break;
            }
        }
    } while (menu != 7);
    return 0;
}